

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode expand(UA_NodeStore *ns)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  UA_NodeStoreEntry **__ptr;
  UA_UInt16 UVar4;
  UA_NodeStoreEntry **ppUVar5;
  UA_NodeStoreEntry **e;
  size_t j;
  size_t i;
  UA_NodeStoreEntry **nentries;
  UA_UInt32 nsize;
  UA_UInt32 nindex;
  UA_NodeStoreEntry **oentries;
  UA_UInt32 count;
  UA_UInt32 osize;
  UA_NodeStore *ns_local;
  
  uVar1 = ns->size;
  uVar2 = ns->count;
  if ((uVar2 << 1 < uVar1) && ((uVar1 < uVar2 << 3 || (uVar1 < 0x41)))) {
    ns_local._4_4_ = 0;
  }
  else {
    __ptr = ns->entries;
    UVar4 = higher_prime_index(uVar2 << 1);
    uVar3 = primes[(uint)UVar4];
    ppUVar5 = (UA_NodeStoreEntry **)calloc((ulong)uVar3,8);
    if (ppUVar5 == (UA_NodeStoreEntry **)0x0) {
      ns_local._4_4_ = 0x80030000;
    }
    else {
      ns->entries = ppUVar5;
      ns->size = uVar3;
      ns->sizePrimeIndex = (uint)UVar4;
      e = (UA_NodeStoreEntry **)0x0;
      for (j = 0; j < uVar1 && e < (UA_NodeStoreEntry **)(ulong)uVar2; j = j + 1) {
        if ((UA_NodeStoreEntry *)0x1 < __ptr[j]) {
          ppUVar5 = findSlot(ns,&(__ptr[j]->node).nodeId);
          if (ppUVar5 == (UA_NodeStoreEntry **)0x0) {
            __assert_fail("e",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                          ,0x4b28,"UA_StatusCode expand(UA_NodeStore *)");
          }
          *ppUVar5 = __ptr[j];
          e = (UA_NodeStoreEntry **)((long)e + 1);
        }
      }
      free(__ptr);
      ns_local._4_4_ = 0;
    }
  }
  return ns_local._4_4_;
}

Assistant:

static UA_StatusCode
expand(UA_NodeStore *ns) {
    UA_UInt32 osize = ns->size;
    UA_UInt32 count = ns->count;
    /* Resize only when table after removal of unused elements is either too
       full or too empty */
    if(count * 2 < osize && (count * 8 > osize || osize <= UA_NODESTORE_MINSIZE))
        return UA_STATUSCODE_GOOD;

    UA_NodeStoreEntry **oentries = ns->entries;
    UA_UInt32 nindex = higher_prime_index(count * 2);
    UA_UInt32 nsize = primes[nindex];
    UA_NodeStoreEntry **nentries = UA_calloc(nsize, sizeof(UA_NodeStoreEntry*));
    if(!nentries)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    ns->entries = nentries;
    ns->size = nsize;
    ns->sizePrimeIndex = nindex;

    /* recompute the position of every entry and insert the pointer */
    for(size_t i = 0, j = 0; i < osize && j < count; ++i) {
        if(oentries[i] <= UA_NODESTORE_TOMBSTONE)
            continue;
        UA_NodeStoreEntry **e = findSlot(ns, &oentries[i]->node.nodeId);
        UA_assert(e);
        *e = oentries[i];
        ++j;
    }

    UA_free(oentries);
    return UA_STATUSCODE_GOOD;
}